

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::NewScObjectHostDispatchOrProxy
              (RecyclableObject *function,ScriptContext *requestContext)

{
  bool bVar1;
  ScriptContext *scriptContext;
  RecyclableObject *pRVar2;
  Var aValue;
  JavascriptLibrary *this;
  DynamicObject *local_30;
  Var object;
  RecyclableObject *prototype;
  ScriptContext *functionScriptContext;
  ScriptContext *requestContext_local;
  RecyclableObject *function_local;
  
  scriptContext = RecyclableObject::GetScriptContext(function);
  pRVar2 = GetPrototypeObject(function,scriptContext);
  aValue = CrossSite::MarshalVar(requestContext,pRVar2,scriptContext);
  pRVar2 = VarTo<Js::RecyclableObject>(aValue);
  this = ScriptContext::GetLibrary(requestContext);
  local_30 = JavascriptLibrary::CreateObject(this,pRVar2,0);
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar1) {
    pRVar2 = Js::JavascriptProxy::AutoProxyWrapper(local_30);
    local_30 = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar2);
  }
  return local_30;
}

Assistant:

Var JavascriptOperators::NewScObjectHostDispatchOrProxy(RecyclableObject * function, ScriptContext * requestContext)
    {
        ScriptContext* functionScriptContext = function->GetScriptContext();

        RecyclableObject * prototype = JavascriptOperators::GetPrototypeObject(function, functionScriptContext);
        prototype = VarTo<RecyclableObject>(CrossSite::MarshalVar(requestContext, prototype, functionScriptContext));

        Var object = requestContext->GetLibrary()->CreateObject(prototype);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
        }
#endif
        return object;
    }